

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImFont::ImFont(ImFont *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar3 [16];
  undefined1 auVar2 [64];
  
  (this->IndexAdvanceX).Size = 0;
  (this->IndexAdvanceX).Capacity = 0;
  (this->IndexAdvanceX).Data = (float *)0x0;
  this->FallbackAdvanceX = 0.0;
  this->FontSize = 0.0;
  (this->IndexLookup).Size = 0;
  (this->IndexLookup).Capacity = 0;
  auVar2 = ZEXT464(0) << 0x40;
  auVar1 = auVar2._0_16_;
  auVar3 = auVar2._16_16_;
  (this->IndexLookup).Size = auVar1._0_4_;
  (this->IndexLookup).Capacity = auVar1._4_4_;
  (this->IndexLookup).Data = (unsigned_short *)auVar1._8_8_;
  (this->Glyphs).Size = auVar3._0_4_;
  (this->Glyphs).Capacity = auVar3._4_4_;
  (this->Glyphs).Data = (ImFontGlyph *)auVar3._8_8_;
  this->FallbackGlyph = (ImFontGlyph *)auVar2._32_8_;
  (this->DisplayOffset).x = (float)(int)auVar2._40_8_;
  (this->DisplayOffset).y = (float)(int)((ulong)auVar2._40_8_ >> 0x20);
  this->ContainerAtlas = (ImFontAtlas *)auVar2._48_8_;
  this->ConfigData = (ImFontConfig *)auVar2._56_8_;
  this->EllipsisChar = 0xffff;
  this->DirtyLookupTables = false;
  this->ConfigDataCount = 0;
  this->FallbackChar = 0x3f;
  this->Scale = 1.0;
  this->Ascent = 0.0;
  this->Descent = 0.0;
  *(undefined8 *)((long)&this->Descent + 2) = 0;
  return;
}

Assistant:

inline ImVector()                                       { Size = Capacity = 0; Data = NULL; }